

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::Boxed_Number::binary_int_go<short,short>
          (Boxed_Number *this,Opers t_oper,short *t,short *u,Boxed_Value *t_lhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  arithmetic_error *this_00;
  bad_any_cast *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  string local_40;
  
  switch(t_oper) {
  case assign_bitwise_and:
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(ushort)(*t & *u);
    break;
  case assign_bitwise_or:
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(ushort)(*t | *u);
    break;
  case assign_shift_left:
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (ulong)((uint)(ushort)*t << ((byte)*u & 0x1f));
    break;
  case assign_shift_right:
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (ulong)(uint)((int)*t >> ((byte)*u & 0x1f));
    break;
  case assign_remainder:
    if (*u == 0) {
      this_00 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_40.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_40.field_2._8_6_ = 0x6f72657a2079;
      local_40._M_string_length = 0xe;
      local_40.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(this_00,&local_40);
      __cxa_throw(this_00,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error)
      ;
    }
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)(int)*t % (long)(int)*u & 0xffffffff);
    break;
  case assign_bitwise_xor:
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(ushort)(*t ^ *u);
    break;
  default:
    this_01 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_01);
    __cxa_throw(this_01,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  *t = (short)_Var2._M_pi;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (t_lhs->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value binary_int_go(Operators::Opers t_oper, T &t, const U &u, const Boxed_Value &t_lhs) 
      {
        switch (t_oper)
        {
          case Operators::assign_bitwise_and:
            t &= u;
            break;
          case Operators::assign_bitwise_or:
            t |= u;
            break;
          case Operators::assign_shift_left:
            t <<= u;
            break;
          case Operators::assign_shift_right:
            t >>= u;
            break;
          case Operators::assign_remainder:
            check_divide_by_zero(u);
            t %= u;
            break;
          case Operators::assign_bitwise_xor:
            t ^= u;
            break;
          default:
            throw chaiscript::detail::exception::bad_any_cast();
        }
        return t_lhs;
      }